

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O3

bool __thiscall crunch::convert(crunch *this)

{
  file_desc *pfVar1;
  double dVar2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  file_desc *pfVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  undefined8 in_R8;
  undefined8 uVar9;
  int iVar10;
  long lVar11;
  param_map_const_iterator pVar12;
  command_line_params *this_00;
  uint min_new_capacity;
  file_desc_vec files;
  param_map_const_iterator end;
  timer tm;
  file_desc_vec local_78;
  param_map_const_iterator local_60;
  command_line_params *local_58;
  uint local_4c;
  timer local_48;
  
  local_78.m_p = (file_desc *)0x0;
  local_78.m_size = 0;
  local_78.m_capacity = 0;
  local_58 = &this->m_params;
  uVar9 = CONCAT71((int7)((ulong)in_R8 >> 8),1);
  iVar10 = 0;
  do {
    pcVar8 = "";
    local_48.m_start_time = 0;
    local_60._M_node = (_Rb_tree_node_base *)0x0;
    local_4c = (uint)uVar9;
    if ((char)uVar9 != '\0') {
      pcVar8 = "file";
    }
    crnlib::command_line_params::find
              (local_58,pcVar8,(param_map_const_iterator *)&local_48,&local_60);
    p_Var4 = (_Rb_tree_node_base *)local_48.m_start_time;
    pVar12._M_node = local_60._M_node;
    if (local_60._M_node != (_Base_ptr)local_48.m_start_time) {
      do {
        if (*(int *)&p_Var4[1]._M_right != 0) {
          lVar11 = 0;
          uVar7 = 0;
          do {
            bVar3 = process_input_spec(this,&local_78,
                                       (dynamic_string *)
                                       ((long)&(p_Var4[1]._M_left)->_M_color + lVar11));
            if ((!bVar3) &&
               (bVar3 = crnlib::command_line_params::get_value_as_bool
                                  (local_58,"ignoreerrors",0,false), !bVar3)) goto LAB_0010b2f0;
            uVar7 = uVar7 + 1;
            lVar11 = lVar11 + 0x10;
            pVar12._M_node = local_60._M_node;
          } while (uVar7 < *(uint *)&p_Var4[1]._M_right);
        }
        iVar10 = iVar10 + 1;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      } while (p_Var4 != pVar12._M_node);
    }
    this_00 = local_58;
    pfVar5 = local_78.m_p;
    uVar9 = 0;
  } while ((local_4c & 1) != 0);
  if (iVar10 == 0) {
    pcVar8 = "No input files specified!";
  }
  else {
    uVar7 = local_78._8_8_ & 0xffffffff;
    if (uVar7 != 0) {
      pfVar1 = local_78.m_p + uVar7;
      lVar11 = 0x3f;
      if (uVar7 != 0) {
        for (; local_78.m_size >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      std::__introsort_loop<crnlib::find_files::file_desc*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_78.m_p,pfVar1,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<crnlib::find_files::file_desc*,__gnu_cxx::__ops::_Iter_less_iter>
                (pfVar5,pfVar1);
      pfVar5 = std::__unique<crnlib::find_files::file_desc*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                         (local_78.m_p,local_78.m_p + (local_78._8_8_ & 0xffffffff));
      uVar7 = ((long)pfVar5 - (long)local_78.m_p >> 3) * -0x71c71c71c71c71c7;
      min_new_capacity = (uint)uVar7;
      uVar6 = local_78.m_size - min_new_capacity;
      if (uVar6 != 0) {
        if (local_78.m_size < min_new_capacity || uVar6 == 0) {
          if (local_78.m_capacity < min_new_capacity) {
            crnlib::elemental_vector::increase_capacity
                      ((elemental_vector *)&local_78,min_new_capacity,
                       local_78.m_size + 1 == min_new_capacity,0x48,
                       crnlib::vector<crnlib::find_files::file_desc>::object_mover,false);
          }
          if (min_new_capacity - local_78.m_size != 0) {
            pfVar5 = local_78.m_p + local_78.m_size;
            pfVar1 = pfVar5 + (min_new_capacity - local_78.m_size);
            do {
              (pfVar5->m_fullname).m_buf_size = 0;
              (pfVar5->m_fullname).m_len = 0;
              (pfVar5->m_fullname).m_pStr = (char *)0x0;
              (pfVar5->m_base).m_buf_size = 0;
              (pfVar5->m_base).m_len = 0;
              (pfVar5->m_base).m_pStr = (char *)0x0;
              (pfVar5->m_rel).m_buf_size = 0;
              (pfVar5->m_rel).m_len = 0;
              (pfVar5->m_rel).m_pStr = (char *)0x0;
              (pfVar5->m_name).m_buf_size = 0;
              (pfVar5->m_name).m_len = 0;
              (pfVar5->m_name).m_pStr = (char *)0x0;
              pfVar5->m_is_dir = false;
              pfVar5 = pfVar5 + 1;
            } while (pfVar5 != pfVar1);
          }
        }
        else {
          pfVar5 = local_78.m_p + (uVar7 & 0xffffffff);
          lVar11 = (ulong)uVar6 * 0x48;
          do {
            crnlib::find_files::file_desc::~file_desc(pfVar5);
            pfVar5 = pfVar5 + 1;
            lVar11 = lVar11 + -0x48;
          } while (lVar11 != 0);
        }
        local_78.m_size = min_new_capacity;
        this_00 = local_58;
      }
      crnlib::timer::timer(&local_48);
      crnlib::timer::start(&local_48);
      bVar3 = process_files(this,&local_78);
      if ((bVar3) ||
         (bVar3 = crnlib::command_line_params::get_value_as_bool(this_00,"ignoreerrors",0,false),
         bVar3)) {
        dVar2 = crnlib::timer::get_elapsed_secs(&local_48);
        bVar3 = true;
        crnlib::console::printf("Total time: %3.3fs",SUB84(dVar2,0));
        crnlib::console::printf
                  ((char *)(ulong)((uint)(this->m_num_failed != 0 || this->m_num_skipped != 0) * 3 +
                                  2),
                   "%u total file(s) successfully processed, %u file(s) skipped, %u file(s) failed."
                   ,(ulong)this->m_num_succeeded);
      }
      else {
LAB_0010b2f0:
        bVar3 = false;
      }
      goto LAB_0010b2f2;
    }
    pcVar8 = "No files found to process!";
  }
  bVar3 = false;
  crnlib::console::error(pcVar8);
LAB_0010b2f2:
  if (local_78.m_p != (file_desc *)0x0) {
    if ((local_78._8_8_ & 0xffffffff) != 0) {
      lVar11 = (local_78._8_8_ & 0xffffffff) * 0x48;
      pfVar5 = local_78.m_p;
      do {
        crnlib::find_files::file_desc::~file_desc(pfVar5);
        pfVar5 = pfVar5 + 1;
        lVar11 = lVar11 + -0x48;
      } while (lVar11 != 0);
    }
    crnlib::crnlib_free(local_78.m_p);
  }
  return bVar3;
}

Assistant:

bool convert() {
    find_files::file_desc_vec files;

    uint32 total_input_specs = 0;

    for (uint32 phase = 0; phase < 2; phase++) {
      command_line_params::param_map_const_iterator begin, end;
      m_params.find(phase ? "" : "file", begin, end);
      for (command_line_params::param_map_const_iterator it = begin; it != end; ++it) {
        total_input_specs++;

        const dynamic_string_array& strings = it->second.m_values;
        for (uint32 i = 0; i < strings.size(); i++) {
          if (!process_input_spec(files, strings[i])) {
            if (!m_params.get_value_as_bool("ignoreerrors"))
              return false;
          }
        }
      }
    }

    if (!total_input_specs) {
      console::error("No input files specified!");
      return false;
    }

    if (files.empty()) {
      console::error("No files found to process!");
      return false;
    }

    std::sort(files.begin(), files.end());
    files.resize((uint32)(std::unique(files.begin(), files.end()) - files.begin()));

    timer tm;
    tm.start();

    if (!process_files(files)) {
      if (!m_params.get_value_as_bool("ignoreerrors"))
        return false;
    }

    double total_time = tm.get_elapsed_secs();

    console::printf("Total time: %3.3fs", total_time);

    console::printf(
        ((m_num_skipped) || (m_num_failed)) ? cWarningConsoleMessage : cInfoConsoleMessage,
        "%u total file(s) successfully processed, %u file(s) skipped, %u file(s) failed.", m_num_succeeded, m_num_skipped, m_num_failed);

    return true;
  }